

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O1

void __thiscall Simulator::push_integer(Simulator *this,PCode *code)

{
  uint uVar1;
  undefined1 auVar2 [16];
  exception eVar3;
  undefined3 uVar4;
  bool bVar5;
  simulator_error *this_00;
  long *plVar6;
  Symbol *pSVar7;
  undefined8 *puVar8;
  long *plVar9;
  pointer piVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  undefined1 auVar11 [16];
  Symbol symbol;
  int local_11c;
  undefined1 local_118 [32];
  pointer local_f8;
  pointer local_e8;
  pointer pdStack_e0;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [40];
  vector<Symbol,_std::allocator<Symbol>_> local_88;
  pointer local_70;
  pointer local_68;
  pointer local_48;
  bool local_30;
  
  str = &code->first_;
  bVar5 = Recognition::is_integer(str);
  if (bVar5) {
    str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (str->_M_dataplus)._M_p;
    this_00 = (simulator_error *)__errno_location();
    eVar3 = this_00->super_exception;
    uVar4 = *(undefined3 *)&this_00->field_0x1;
    *(uint *)this_00 = 0;
    plVar6 = (long *)strtol((char *)str,(char **)local_118,10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._0_8_ == str)
    {
      std::__throw_invalid_argument("stoi");
      goto LAB_0011b9c1;
    }
    local_b0._8_4_ = SUB84(plVar6,0);
    plVar9 = (long *)(long)(int)local_b0._8_4_;
    if (plVar9 == plVar6) {
      uVar1 = *(uint *)this_00;
      plVar9 = (long *)(ulong)uVar1;
      if (uVar1 != 0x22) {
        if (uVar1 == 0) {
          this_00->super_exception = eVar3;
          *(undefined3 *)&this_00->field_0x1 = uVar4;
        }
        local_b0._0_4_ = kInt;
        local_b0._16_8_ = (pointer)0x0;
        local_b0._24_8_ = (pointer)0x0;
        local_b0._32_8_ = (pointer)0x0;
        local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        local_70 = (pointer)0x0;
        std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
                  (&this->stack_,(StackSymbol *)local_b0);
        if (local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                          super__Vector_impl_data._M_finish);
        }
        piVar10 = (pointer)local_b0._16_8_;
        if ((pointer)local_b0._16_8_ == (pointer)0x0) goto LAB_0011b99f;
        goto LAB_0011b99a;
      }
    }
    auVar11 = std::__throw_out_of_range("stoi");
  }
  else {
    pSVar7 = ScopeTree::resolve(&this->tree_,str);
    Symbol::Symbol((Symbol *)local_b0,pSVar7);
    if (local_30 == true) {
      local_118._0_8_ = (ulong)(uint)local_118._4_4_ << 0x20;
      local_118._16_8_ = (pointer)0x0;
      local_118._24_8_ = (pointer)0x0;
      local_f8 = (pointer)0x0;
      local_e8 = (pointer)0x0;
      pdStack_e0 = (pointer)0x0;
      local_d8 = (pointer)0x0;
      local_118._8_4_ = (int)local_70;
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
                (&this->stack_,(StackSymbol *)local_118);
      if (local_e8 != (pointer)0x0) {
        operator_delete(local_e8);
      }
      if ((pointer)local_118._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._16_8_);
      }
      if (local_48 != (pointer)0x0) {
        operator_delete(local_48);
      }
      if (local_68 != (pointer)0x0) {
        operator_delete(local_68);
      }
      std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_88);
      piVar10 = (pointer)CONCAT44(local_b0._4_4_,local_b0._0_4_);
      if (piVar10 == (pointer)(local_b0 + 0x10)) goto LAB_0011b99f;
LAB_0011b99a:
      operator_delete(piVar10);
LAB_0011b99f:
      this->eip_ = this->eip_ + 1;
      return;
    }
LAB_0011b9c1:
    this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
    local_11c = this->eip_;
    std::operator+(&local_d0,anon_var_dwarf_b5161 + 0xf,str);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
    auVar2._8_8_ = local_118 + 0x10;
    auVar2._0_8_ = plVar6;
    auVar11._8_8_ = (long *)*plVar6;
    auVar11._0_8_ = plVar6;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_118._16_8_ = *plVar9;
      local_118._24_8_ = plVar6[3];
      goto LAB_0011ba37;
    }
  }
  local_118._16_8_ = *plVar9;
  auVar2 = auVar11;
LAB_0011ba37:
  local_118._0_8_ = auVar2._8_8_;
  puVar8 = auVar2._0_8_;
  local_118._8_8_ = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  simulator_error::simulator_error(this_00,&local_11c,(string *)local_118);
  __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
}

Assistant:

void Simulator::push_integer(const PCode &code) {
    if (Recognition::is_integer(code.first())) {
        stack_.push_back(StackSymbol(std::stoi(code.first())));
    } else {
        Symbol symbol = tree_.resolve(code.first());
        if (symbol.is_assigned()) {
            stack_.push_back(StackSymbol(symbol.int_value()));
        } else {
            throw simulator_error(eip(), "变量 \"" + code.first() + "\" 未初始化而直接使用");
        }
    }
    inc_eip();
}